

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

bool __thiscall
cmGlobalGenerator::IsExcluded
          (cmGlobalGenerator *this,cmLocalGenerator *root,cmGeneratorTarget *target)

{
  cmMakefile *this_00;
  bool bVar1;
  cmValue cVar2;
  string *psVar3;
  ostream *poVar4;
  cmLocalGenerator *gen;
  char *extraout_RDX;
  pointer pbVar5;
  bool bVar6;
  string_view value;
  int local_290;
  int local_28c;
  string local_260;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_240;
  string local_228;
  string EXCLUDE_FROM_ALL;
  string local_1e8;
  string local_1c8;
  cmGeneratorExpressionInterpreter genexInterpreter;
  
  bVar1 = cmGeneratorTarget::IsInBuildSystem(target);
  bVar6 = true;
  if (bVar1) {
    this_00 = root->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&EXCLUDE_FROM_ALL,"EXCLUDE_FROM_ALL",(allocator<char> *)&genexInterpreter);
    cVar2 = cmGeneratorTarget::GetProperty(target,&EXCLUDE_FROM_ALL);
    if (cVar2.Value == (string *)0x0) {
      gen = cmGeneratorTarget::GetLocalGenerator(target);
      bVar6 = IsExcluded((cmGlobalGenerator *)target,root,gen);
    }
    else {
      local_290 = 0;
      cmMakefile::GetGeneratorConfigs_abi_cxx11_(&local_240,this_00,IncludeEmptyConfig);
      local_28c = 0;
      for (pbVar5 = local_240.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar5 != local_240.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pbVar5 = pbVar5 + 1) {
        std::__cxx11::string::string((string *)&local_1c8,(string *)pbVar5);
        local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
        local_228._M_string_length = 0;
        local_228.field_2._M_local_buf[0] = '\0';
        cmGeneratorExpressionInterpreter::cmGeneratorExpressionInterpreter
                  (&genexInterpreter,root,&local_1c8,target,&local_228);
        std::__cxx11::string::~string((string *)&local_228);
        std::__cxx11::string::~string((string *)&local_1c8);
        std::__cxx11::string::string((string *)&local_1e8,(string *)cVar2.Value);
        psVar3 = cmGeneratorExpressionInterpreter::Evaluate
                           (&genexInterpreter,&local_1e8,&EXCLUDE_FROM_ALL);
        value._M_str = extraout_RDX;
        value._M_len = (size_t)(psVar3->_M_dataplus)._M_p;
        bVar1 = cmValue::IsOn((cmValue *)psVar3->_M_string_length,value);
        std::__cxx11::string::~string((string *)&local_1e8);
        local_290 = local_290 + (uint)!bVar1;
        local_28c = local_28c + (uint)bVar1;
        cmGeneratorExpressionInterpreter::~cmGeneratorExpressionInterpreter(&genexInterpreter);
      }
      bVar6 = local_28c != 0;
      if ((bVar6) && (local_290 != 0)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&genexInterpreter);
        poVar4 = std::operator<<((ostream *)&genexInterpreter,
                                 "The EXCLUDE_FROM_ALL property of target \"");
        psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(target);
        poVar4 = std::operator<<(poVar4,(string *)psVar3);
        poVar4 = std::operator<<(poVar4,
                                 "\" varies by configuration. This is not supported by the \"");
        (*root->GlobalGenerator->_vptr_cmGlobalGenerator[3])(&local_260);
        poVar4 = std::operator<<(poVar4,(string *)&local_260);
        std::operator<<(poVar4,"\" generator.");
        std::__cxx11::string::~string((string *)&local_260);
        std::__cxx11::stringbuf::str();
        cmMakefile::IssueMessage(this_00,FATAL_ERROR,&local_260);
        std::__cxx11::string::~string((string *)&local_260);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&genexInterpreter);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_240);
    }
    std::__cxx11::string::~string((string *)&EXCLUDE_FROM_ALL);
  }
  return bVar6;
}

Assistant:

bool cmGlobalGenerator::IsExcluded(cmLocalGenerator* root,
                                   const cmGeneratorTarget* target) const
{
  if (!target->IsInBuildSystem()) {
    return true;
  }
  cmMakefile* mf = root->GetMakefile();
  const std::string EXCLUDE_FROM_ALL = "EXCLUDE_FROM_ALL";
  if (cmValue exclude = target->GetProperty(EXCLUDE_FROM_ALL)) {
    // Expand the property value per configuration.
    unsigned int trueCount = 0;
    unsigned int falseCount = 0;
    const std::vector<std::string>& configs =
      mf->GetGeneratorConfigs(cmMakefile::IncludeEmptyConfig);
    for (const std::string& config : configs) {
      cmGeneratorExpressionInterpreter genexInterpreter(root, config, target);
      if (cmIsOn(genexInterpreter.Evaluate(*exclude, EXCLUDE_FROM_ALL))) {
        ++trueCount;
      } else {
        ++falseCount;
      }
    }

    // Check whether the genex expansion of the property agrees in all
    // configurations.
    if (trueCount > 0 && falseCount > 0) {
      std::ostringstream e;
      e << "The EXCLUDE_FROM_ALL property of target \"" << target->GetName()
        << "\" varies by configuration. This is not supported by the \""
        << root->GetGlobalGenerator()->GetName() << "\" generator.";
      mf->IssueMessage(MessageType::FATAL_ERROR, e.str());
    }
    return trueCount;
  }
  // This target is included in its directory.  Check whether the
  // directory is excluded.
  return this->IsExcluded(root, target->GetLocalGenerator());
}